

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

QCollator * __thiscall QCollator::operator=(QCollator *this,QCollator *other)

{
  bool bVar1;
  QCollator *in_RSI;
  QCollator *in_RDI;
  QCollatorPrivate *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    if (((in_RDI->d != (QCollatorPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x4c1e2b), !bVar1)) &&
       (in_stack_ffffffffffffffe0 = in_RDI->d, in_stack_ffffffffffffffe0 != (QCollatorPrivate *)0x0)
       ) {
      QCollatorPrivate::~QCollatorPrivate(in_stack_ffffffffffffffe0);
      operator_delete(in_stack_ffffffffffffffe0,0x20);
    }
    in_RDI->d = in_RSI->d;
    if (in_RDI->d != (QCollatorPrivate *)0x0) {
      QCollatorPrivate::ensureInitialized(in_stack_ffffffffffffffe0);
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)in_stack_ffffffffffffffe0);
    }
  }
  return in_RDI;
}

Assistant:

QCollator &QCollator::operator=(const QCollator &other)
{
    if (this != &other) {
        if (d && !d->ref.deref())
            delete d;
        d = other.d;
        if (d) {
            // Ensure clean, lest both copies try to init() at the same time:
            d->ensureInitialized();
            d->ref.ref();
        }
    }
    return *this;
}